

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void bk_lib::detail::fill<Clasp::ClaspConfig::Impl::ConfiguratorProxy>
               (ConfiguratorProxy *first,ConfiguratorProxy *last,ConfiguratorProxy *x)

{
  uint uVar1;
  ConfiguratorProxy *x_local;
  ConfiguratorProxy *last_local;
  ConfiguratorProxy *first_local;
  
  last_local._0_4_ = (int)last;
  first_local._0_4_ = (int)first;
  uVar1 = (int)last_local - (int)first_local;
  first_local = first;
  switch(uVar1 >> 4 & 7) {
  case 0:
    first_local = first;
    while (first_local != last) {
      first_local->cfg = x->cfg;
      first_local->set = x->set;
      first_local = first_local + 1;
switchD_0012aac2_caseD_7:
      first_local->cfg = x->cfg;
      first_local->set = x->set;
      first_local = first_local + 1;
switchD_0012aac2_caseD_6:
      first_local->cfg = x->cfg;
      first_local->set = x->set;
      first_local = first_local + 1;
switchD_0012aac2_caseD_5:
      first_local->cfg = x->cfg;
      first_local->set = x->set;
      first_local = first_local + 1;
switchD_0012aac2_caseD_4:
      first_local->cfg = x->cfg;
      first_local->set = x->set;
      first_local = first_local + 1;
switchD_0012aac2_caseD_3:
      first_local->cfg = x->cfg;
      first_local->set = x->set;
      first_local = first_local + 1;
switchD_0012aac2_caseD_2:
      first_local->cfg = x->cfg;
      first_local->set = x->set;
      first_local = first_local + 1;
switchD_0012aac2_caseD_1:
      first_local->cfg = x->cfg;
      first_local->set = x->set;
      first_local = first_local + 1;
    }
    break;
  case 1:
    goto switchD_0012aac2_caseD_1;
  case 2:
    goto switchD_0012aac2_caseD_2;
  case 3:
    goto switchD_0012aac2_caseD_3;
  case 4:
    goto switchD_0012aac2_caseD_4;
  case 5:
    goto switchD_0012aac2_caseD_5;
  case 6:
    goto switchD_0012aac2_caseD_6;
  case 7:
    goto switchD_0012aac2_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}